

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbisetb.cpp
# Opt level: O3

void __thiscall icu_63::RangeDescriptor::setDictionaryFlag(RangeDescriptor *this)

{
  byte *pbVar1;
  int *piVar2;
  int8_t iVar3;
  void *pvVar4;
  int length;
  int index;
  UVector *this_00;
  
  this_00 = this->fIncludesSets;
  if (0 < this_00->count) {
    index = 0;
    do {
      pvVar4 = UVector::elementAt(this_00,index);
      if (((*(long *)((long)pvVar4 + 8) != 0) &&
          (piVar2 = *(int **)(*(long *)((long)pvVar4 + 8) + 8), piVar2 != (int *)0x0)) &&
         (*piVar2 == 2)) {
        if ((short)piVar2[0xe] < 0) {
          length = piVar2[0xf];
        }
        else {
          length = (int)(short)piVar2[0xe] >> 5;
        }
        iVar3 = UnicodeString::doCompare
                          ((UnicodeString *)(piVar2 + 0xc),0,length,L"dictionary",0,-1);
        if (iVar3 == '\0') {
          pbVar1 = (byte *)((long)&this->fNum + 1);
          *pbVar1 = *pbVar1 | 0x40;
          return;
        }
      }
      index = index + 1;
      this_00 = this->fIncludesSets;
    } while (index < this_00->count);
  }
  return;
}

Assistant:

void RangeDescriptor::setDictionaryFlag() {
    int i;

    static const char16_t *dictionary = u"dictionary";
    for (i=0; i<fIncludesSets->size(); i++) {
        RBBINode *usetNode  = (RBBINode *)fIncludesSets->elementAt(i);
        RBBINode *setRef = usetNode->fParent;
        if (setRef != nullptr) {
            RBBINode *varRef = setRef->fParent;
            if (varRef && varRef->fType == RBBINode::varRef) {
                const UnicodeString *setName = &varRef->fText;
                if (setName->compare(dictionary, -1) == 0) {
                    fNum |= RBBISetBuilder::DICT_BIT;
                    break;
                }
            }
        }
    }
}